

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cppcms::mount_point::match_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,mount_point *this,char *h,char *s,char *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  cmatch m;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  cmatch local_58;
  
  this_00 = &__return_storage_ptr__->second;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->first = false;
  cVar2 = booster::regex::empty();
  if (cVar2 == '\0') {
    sVar4 = strlen(h);
    cVar2 = booster::regex::match((char *)this,h,(int)sVar4 + (int)h);
    if (cVar2 == '\0') {
      return __return_storage_ptr__;
    }
  }
  if (this->selection_ == match_path_info) {
    cVar2 = booster::regex::empty();
    if (cVar2 == '\0') {
      sVar4 = strlen(s);
      cVar2 = booster::regex::match((char *)&this->script_name_,s,(int)sVar4 + (int)s);
      if (cVar2 == '\0') {
        return __return_storage_ptr__;
      }
    }
    cVar2 = booster::regex::empty();
    if (cVar2 != '\0') {
      pcVar1 = (char *)(__return_storage_ptr__->second)._M_string_length;
      strlen(p);
      std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar1,(ulong)p);
      goto LAB_00216c92;
    }
    if (this->group_ == 0) {
      sVar4 = strlen(p);
      cVar2 = booster::regex::match((char *)&this->path_info_,p,(int)sVar4 + (int)p);
      if (cVar2 == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::operator=((string *)this_00,p);
      goto LAB_00216c92;
    }
    local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.begin_ = (char *)0x0;
    local_58.end_ = (char *)0x0;
    local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = booster::regex_match<booster::regex>(p,&local_58,&this->path_info_,0);
    if (!bVar3) goto LAB_00216c17;
    lVar5 = (long)this->group_;
    if (((lVar5 < 0) ||
        ((int)((ulong)((long)local_58.offsets_.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) <= this->group_)) ||
       ((long)local_58.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[lVar5].first == -1)) goto LAB_00216bdc;
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               local_58.begin_ +
               local_58.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5].first,
               local_58.begin_ +
               local_58.offsets_.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5].second);
  }
  else {
    cVar2 = booster::regex::empty();
    if (cVar2 == '\0') {
      sVar4 = strlen(p);
      cVar2 = booster::regex::match((char *)&this->path_info_,p,(int)sVar4 + (int)p);
      if (cVar2 == '\0') {
        return __return_storage_ptr__;
      }
    }
    cVar2 = booster::regex::empty();
    if (cVar2 != '\0') {
      pcVar1 = (char *)(__return_storage_ptr__->second)._M_string_length;
      strlen(s);
      std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar1,(ulong)s);
LAB_00216c92:
      __return_storage_ptr__->first = true;
      return __return_storage_ptr__;
    }
    if (this->group_ == 0) {
      sVar4 = strlen(s);
      cVar2 = booster::regex::match((char *)&this->script_name_,s,(int)sVar4 + (int)s);
      if (cVar2 == '\0') {
        return __return_storage_ptr__;
      }
      pcVar1 = (char *)(__return_storage_ptr__->second)._M_string_length;
      strlen(s);
      std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar1,(ulong)s);
      goto LAB_00216c92;
    }
    local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.begin_ = (char *)0x0;
    local_58.end_ = (char *)0x0;
    local_58.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = booster::regex_match<booster::regex>(s,&local_58,&this->script_name_,0);
    if (!bVar3) goto LAB_00216c17;
    lVar5 = (long)this->group_;
    if (((lVar5 < 0) ||
        ((int)((ulong)((long)local_58.offsets_.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) <= this->group_)) ||
       ((long)local_58.offsets_.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start[lVar5].first == -1)) {
LAB_00216bdc:
      local_78 = local_68;
      local_70 = 0;
      local_68[0] = 0;
    }
    else {
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 local_58.begin_ +
                 local_58.offsets_.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5].first,
                 local_58.begin_ +
                 local_58.offsets_.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5].second);
    }
  }
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_78);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  __return_storage_ptr__->first = true;
LAB_00216c17:
  if (local_58.offsets_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(local_58.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool,std::string> mount_point::match(char const *h,char const *s,char const *p) const
{
	std::pair<bool,std::string> res;
	res.first = false;

	if(!host_.empty() && !booster::regex_match(h,host_))
		return res;

	if(selection_ == match_path_info) {
		if(!script_name_.empty() && !booster::regex_match(s,script_name_))
			return res;
		if(path_info_.empty()) {
			res.second = p;
			res.first = true;
			return res;
		}
		
		if(group_ == 0) {
			if(!booster::regex_match(p,path_info_))
				return res;
			res.second=p;
			res.first=true;
			return res;
		}
		else {
			booster::cmatch m;
			if(!booster::regex_match(p,m,path_info_))
				return res;
			res.second=m[group_];
			res.first = true;
			return res;
		}
	}
	else {
		if(!path_info_.empty() && !booster::regex_match(p,path_info_))
			return res;
		if(script_name_.empty()) {
			res.second=s;
			res.first = true;
			return res;
		}
		if(group_ == 0) {
			if(!booster::regex_match(s,script_name_))
				return res;
			res.second=s;
			res.first = true;
			return res;
		}
		else {
			booster::cmatch m;
			if(!booster::regex_match(s,m,script_name_))
				return res;
			res.second=m[group_];
			res.first = true;
			return res;
		}
	}
}